

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

float __thiscall ImGuiMenuColumns::DeclColumns(ImGuiMenuColumns *this,float w0,float w1,float w2)

{
  float fVar1;
  float local_30;
  int local_20;
  int i;
  float w2_local;
  float w1_local;
  float w0_local;
  ImGuiMenuColumns *this_local;
  
  this->NextWidth = 0.0;
  fVar1 = ImMax(this->NextWidths[0],w0);
  this->NextWidths[0] = fVar1;
  fVar1 = ImMax(this->NextWidths[1],w1);
  this->NextWidths[1] = fVar1;
  fVar1 = ImMax(this->NextWidths[2],w2);
  this->NextWidths[2] = fVar1;
  for (local_20 = 0; local_20 < 3; local_20 = local_20 + 1) {
    if ((local_20 < 1) || (this->NextWidths[local_20] <= 0.0)) {
      local_30 = 0.0;
    }
    else {
      local_30 = this->Spacing;
    }
    this->NextWidth = this->NextWidths[local_20] + local_30 + this->NextWidth;
  }
  fVar1 = ImMax(this->Width,this->NextWidth);
  return fVar1;
}

Assistant:

float ImGuiMenuColumns::DeclColumns(float w0, float w1, float w2) // not using va_arg because they promote float to double
{
    NextWidth = 0.0f;
    NextWidths[0] = ImMax(NextWidths[0], w0);
    NextWidths[1] = ImMax(NextWidths[1], w1);
    NextWidths[2] = ImMax(NextWidths[2], w2);
    for (int i = 0; i < 3; i++)
        NextWidth += NextWidths[i] + ((i > 0 && NextWidths[i] > 0.0f) ? Spacing : 0.0f);
    return ImMax(Width, NextWidth);
}